

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

QRect __thiscall QDockAreaLayoutInfo::separatorRect(QDockAreaLayoutInfo *this,QList<int> *path)

{
  int index;
  ulong originalLength;
  QDockAreaLayoutInfo *this_00;
  Data *pDVar1;
  CutResult CVar2;
  long in_FS_OFFSET;
  QRect QVar3;
  QArrayData *d;
  qsizetype p;
  QList<int> local_58;
  qsizetype local_40;
  qsizetype local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  originalLength = (path->d).size;
  index = *(path->d).ptr;
  if (originalLength < 2) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QVar3 = separatorRect(this,index);
      return QVar3;
    }
  }
  else {
    this_00 = (this->item_list).d.ptr[index].subinfo;
    local_38 = 1;
    local_40 = -1;
    CVar2 = QtPrivate::QContainerImplHelper::mid(originalLength,&local_38,&local_40);
    if (CVar2 < Full) {
      local_58.d.d = (Data *)0x0;
      local_58.d.ptr = (int *)0x0;
      local_58.d.size = 0;
      QVar3 = separatorRect(this_00,&local_58);
    }
    else {
      if (CVar2 == Full) {
        local_58.d.d = (path->d).d;
        local_58.d.ptr = (path->d).ptr;
        local_58.d.size = (path->d).size;
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
          super___atomic_base<int>._M_i =
               (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
      }
      else {
        local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.ptr =
             (int *)QArrayData::allocate((QArrayData **)&local_58,4,0x10,local_40,KeepSize);
        local_58.d.size = local_40;
        pDVar1 = local_58.d.d;
        if (local_40 != 0) {
          memcpy(local_58.d.ptr,(path->d).ptr + local_38,local_40 * 4);
        }
        local_58.d.d = pDVar1;
        if (&pDVar1->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
          LOCK();
          (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar1->super_QArrayData,4,0x10);
          }
        }
      }
      pDVar1 = local_58.d.d;
      QVar3 = separatorRect(this_00,&local_58);
      if (&pDVar1->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,4,0x10);
        }
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return QVar3;
    }
  }
  __stack_chk_fail();
}

Assistant:

QRect QDockAreaLayoutInfo::separatorRect(const QList<int> &path) const
{
    Q_ASSERT(!path.isEmpty());

    const int index = path.first();
    if (path.size() > 1) {
        const QDockAreaLayoutItem &item = item_list.at(index);
        Q_ASSERT(item.subinfo != nullptr);
        return item.subinfo->separatorRect(path.mid(1));
    }
    return separatorRect(index);
}